

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O0

QRgbaFloat32 *
convertCMYKToRGBA32F
          (QRgbaFloat32 *buffer,uint *src,int count,QList<unsigned_int> *param_4,
          QDitherInfo *param_5)

{
  long lVar1;
  QRgbaFloat32 *pQVar2;
  QColor *in_RCX;
  int in_EDX;
  QRgbaFloat32 *in_RDI;
  long in_FS_OFFSET;
  QRgbaFloat<float> QVar3;
  int i;
  undefined8 in_stack_ffffffffffffff88;
  int local_6c;
  undefined4 in_stack_ffffffffffffffa8;
  undefined8 local_28;
  undefined8 local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_6c = 0; local_6c < in_EDX; local_6c = local_6c + 1) {
    QCmyk32::fromCmyk32((uint)in_stack_ffffffffffffff88);
    QCmyk32::toColor((QCmyk32 *)CONCAT44(in_EDX,in_stack_ffffffffffffffa8));
    QColor::rgba(in_RCX);
    QVar3 = QRgbaFloat<float>::fromArgb32((uint)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    pQVar2 = in_RDI + local_6c;
    local_28 = QVar3._0_8_;
    pQVar2->r = (float)(undefined4)local_28;
    pQVar2->g = (float)local_28._4_4_;
    local_20 = QVar3._8_8_;
    pQVar2->b = (float)(undefined4)local_20;
    pQVar2->a = (float)local_20._4_4_;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static const QRgbaFloat32 * QT_FASTCALL convertCMYKToRGBA32F(QRgbaFloat32 *buffer, const uint *src, int count,
                                                             const QList<QRgb> *, QDitherInfo *)
{
    for (int i = 0; i < count; ++i)
        buffer[i] = QRgbaFloat32::fromArgb32(QCmyk32::fromCmyk32(src[i]).toColor().rgba());

    return buffer;
}